

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O3

void __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::update_request(reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
                 *this,request *original_request,string *new_target,string *new_host)

{
  request<http::string_body> *this_00;
  _Rb_tree_header *p_Var1;
  string_view s;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  long *plVar4;
  size_t *psVar5;
  string param_str;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
  *local_a8;
  request *local_a0;
  undefined1 local_98 [16];
  _Rb_tree_node_base local_88;
  size_t local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  this_00 = &this->request_;
  s.ptr_ = (new_target->_M_dataplus)._M_p;
  s.len_ = new_target->_M_string_length;
  boost::beast::http::basic_fields<std::allocator<char>_>::realloc_target
            ((basic_fields<std::allocator<char>_> *)this_00,
             &(this->request_).
              super_header<true,_boost::beast::http::basic_fields<std::allocator<char>_>_>.
              super_basic_fields<std::allocator<char>_>.target_or_reason_,s);
  local_98._0_8_ = (new_host->_M_dataplus)._M_p;
  local_98._8_8_ = new_host->_M_string_length;
  boost::beast::http::basic_fields<std::allocator<char>_>::set
            ((basic_fields<std::allocator<char>_> *)this_00,host,(string_view *)local_98);
  p_Var3 = (original_request->header_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(original_request->header_fields)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    do {
      local_98._0_8_ = *(undefined8 *)(p_Var3 + 2);
      local_98._8_8_ = p_Var3[2]._M_parent;
      boost::beast::http::basic_fields<std::allocator<char>_>::set
                ((basic_fields<std::allocator<char>_> *)this_00,*(string_view *)(p_Var3 + 1),
                 (string_view *)local_98);
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  iVar2 = (*((original_request->endpoint).
             super___shared_ptr<m2d::savanna::endpoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_endpoint[2])();
  if (iVar2 != 2) {
    (*((original_request->endpoint).
       super___shared_ptr<m2d::savanna::endpoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_endpoint[3])(local_98);
    if (local_98[0] == (string)0x1) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_98 + 8));
      (*((original_request->endpoint).
         super___shared_ptr<m2d::savanna::endpoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _vptr_endpoint[3])(local_98);
      if (local_98[0] == (string)0x0) {
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                      "reference_type boost::optional<std::map<std::basic_string<char>, std::basic_string<char>>>::get() [T = std::map<std::basic_string<char>, std::basic_string<char>>]"
                     );
      }
      p_Var1 = &local_60._M_impl.super__Rb_tree_header;
      if (local_88._M_parent == (_Base_ptr)0x0) {
        psVar5 = &local_60._M_impl.super__Rb_tree_header._M_node_count;
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_88._M_color = _S_red;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      else {
        local_60._M_impl.super__Rb_tree_header._M_header._M_parent = local_88._M_parent;
        (local_88._M_parent)->_M_parent = &p_Var1->_M_header;
        psVar5 = &local_68;
        local_60._M_impl.super__Rb_tree_header._M_node_count = local_68;
        local_88._M_parent = (_Base_ptr)0x0;
        local_60._M_impl.super__Rb_tree_header._M_header._M_left = local_88._M_left;
        local_60._M_impl.super__Rb_tree_header._M_header._M_right = local_88._M_right;
        local_88._M_left = &local_88;
        local_88._M_right = &local_88;
      }
      *psVar5 = 0;
      local_a8 = this;
      local_a0 = original_request;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = local_88._M_color;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_98 + 8));
      local_c8 = local_b8;
      local_c0 = 0;
      local_b8[0] = 0;
      for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != p_Var1;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        std::__cxx11::string::_M_append((char *)&local_c8,*(ulong *)(p_Var3 + 1));
        std::__cxx11::string::append((char *)&local_c8);
        std::__cxx11::string::_M_append((char *)&local_c8,*(ulong *)(p_Var3 + 2));
        std::__cxx11::string::append((char *)&local_c8);
      }
      std::__cxx11::string::pop_back();
      original_request = local_a0;
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_c8,0,(char *)0x0,
                                  (ulong)(local_a0->body)._M_dataplus._M_p);
      this = local_a8;
      p_Var3 = (_Rb_tree_node_base *)(plVar4 + 2);
      if ((_Rb_tree_node_base *)*plVar4 == p_Var3) {
        local_88._0_8_ = *(undefined8 *)p_Var3;
        local_88._M_parent = (_Base_ptr)plVar4[3];
        local_98._0_8_ = &local_88;
      }
      else {
        local_88._0_8_ = *(undefined8 *)p_Var3;
        local_98._0_8_ = (_Rb_tree_node_base *)*plVar4;
      }
      local_98._8_8_ = plVar4[1];
      *plVar4 = (long)p_Var3;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=
                ((string *)
                 &(local_a8->request_).
                  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                 ,(string *)local_98);
      if ((_Rb_tree_node_base *)local_98._0_8_ != &local_88) {
        operator_delete((void *)local_98._0_8_);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
      boost::beast::http::
      message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::prepare_payload(this_00);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
    }
    else {
      std::__cxx11::string::_M_assign
                ((string *)
                 &(this->request_).
                  super_empty_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0U,_false>
                );
      boost::beast::http::
      message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
      ::prepare_payload(this_00);
    }
  }
  this->follow_location_ = original_request->follow_location;
  return;
}

Assistant:

void update_request(const savanna::ssl_reuse::request& original_request, const std::string& new_target, const std::string& new_host)
		{
			request_.target(new_target);
			request_.set(http::field::host, new_host);
			for (auto & header_field : original_request.header_fields) {
				request_.set(header_field.first, header_field.second);
			}
			if (original_request.endpoint->method() != http::verb::get) {
				if (original_request.endpoint->params()) {
					auto p = *original_request.endpoint->params();
					request_.body() = original_request.body + savanna::param_str(p);
					request_.prepare_payload();
				}
				else {
					request_.body() = original_request.body;
					request_.prepare_payload();
				}
			}
			follow_location_ = original_request.follow_location;
		}